

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O3

void __thiscall
irr::gui::IGUIElement::IGUIElement
          (IGUIElement *this,void **vtt,EGUI_ELEMENT_TYPE type,IGUIEnvironment *environment,
          IGUIElement *parent,s32 id,rect<int> *rectangle)

{
  _func_int **pp_Var1;
  vector2d<int> vVar2;
  
  (this->super_IEventReceiver)._vptr_IEventReceiver = (_func_int **)&PTR__IEventReceiver_00261c10;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IEventReceiver)._vptr_IEventReceiver = pp_Var1;
  *(void **)(pp_Var1[-3] + (long)&(this->super_IEventReceiver)._vptr_IEventReceiver) = vtt[1];
  (this->Children).
  super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->Children;
  (this->Children).
  super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->Children;
  (this->Children).
  super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  _M_node._M_size = 0;
  this->Parent = (IGUIElement *)0x0;
  (this->ParentPos)._M_node = (_List_node_base *)0x0;
  vVar2 = rectangle->LowerRightCorner;
  (this->RelativeRect).UpperLeftCorner = rectangle->UpperLeftCorner;
  (this->RelativeRect).LowerRightCorner = vVar2;
  vVar2 = rectangle->LowerRightCorner;
  (this->AbsoluteRect).UpperLeftCorner = rectangle->UpperLeftCorner;
  (this->AbsoluteRect).LowerRightCorner = vVar2;
  vVar2 = rectangle->LowerRightCorner;
  (this->AbsoluteClippingRect).UpperLeftCorner = rectangle->UpperLeftCorner;
  (this->AbsoluteClippingRect).LowerRightCorner = vVar2;
  vVar2 = rectangle->LowerRightCorner;
  (this->DesiredRect).UpperLeftCorner = rectangle->UpperLeftCorner;
  (this->DesiredRect).LowerRightCorner = vVar2;
  (this->MaxSize).Width = 0;
  (this->MaxSize).Height = 0;
  (this->ScaleRect).UpperLeftCorner.X = 0.0;
  (this->ScaleRect).UpperLeftCorner.Y = 0.0;
  (this->ScaleRect).LowerRightCorner.X = 0.0;
  (this->ScaleRect).LowerRightCorner.Y = 0.0;
  (this->LastParentRect).UpperLeftCorner.X = 0;
  (this->LastParentRect).UpperLeftCorner.Y = 0;
  (this->LastParentRect).LowerRightCorner.X = 0;
  (this->LastParentRect).LowerRightCorner.Y = 0;
  (this->MinSize).Width = 1;
  (this->MinSize).Height = 1;
  this->IsVisible = true;
  this->IsEnabled = true;
  this->IsSubElement = false;
  this->NoClip = false;
  (this->Text).str._M_dataplus._M_p = (pointer)&(this->Text).str.field_2;
  (this->Text).str._M_string_length = 0;
  (this->Text).str.field_2._M_local_buf[0] = L'\0';
  (this->ToolTipText).str._M_dataplus._M_p = (pointer)&(this->ToolTipText).str.field_2;
  (this->ToolTipText).str._M_string_length = 0;
  (this->ToolTipText).str.field_2._M_local_buf[0] = L'\0';
  (this->Name).str._M_dataplus._M_p = (pointer)&(this->Name).str.field_2;
  (this->Name).str._M_string_length = 0;
  (this->Name).str.field_2._M_local_buf[0] = '\0';
  this->ID = id;
  this->IsTabStop = false;
  this->TabOrder = -1;
  this->IsTabGroup = false;
  this->AlignLeft = EGUIA_UPPERLEFT;
  this->AlignRight = EGUIA_UPPERLEFT;
  this->AlignTop = EGUIA_UPPERLEFT;
  this->AlignBottom = EGUIA_UPPERLEFT;
  this->Environment = environment;
  this->Type = type;
  if (parent != (IGUIElement *)0x0) {
    addChildToEnd(parent,this);
    recalculateAbsolutePosition(this,true);
    return;
  }
  return;
}

Assistant:

IGUIElement(EGUI_ELEMENT_TYPE type, IGUIEnvironment *environment, IGUIElement *parent,
			s32 id, const core::rect<s32> &rectangle) :
			Parent(0),
			RelativeRect(rectangle), AbsoluteRect(rectangle),
			AbsoluteClippingRect(rectangle), DesiredRect(rectangle),
			MaxSize(0, 0), MinSize(1, 1), IsVisible(true), IsEnabled(true),
			IsSubElement(false), NoClip(false), ID(id), IsTabStop(false), TabOrder(-1), IsTabGroup(false),
			AlignLeft(EGUIA_UPPERLEFT), AlignRight(EGUIA_UPPERLEFT), AlignTop(EGUIA_UPPERLEFT), AlignBottom(EGUIA_UPPERLEFT),
			Environment(environment), Type(type)
	{
#ifdef _DEBUG
		setDebugName("IGUIElement");
#endif

		// if we were given a parent to attach to
		if (parent) {
			parent->addChildToEnd(this);
			recalculateAbsolutePosition(true);
		}
	}